

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void __thiscall AnonSimpleFile::AnonSimpleFile(AnonSimpleFile *this,string *FileName)

{
  int iVar1;
  int *piVar2;
  string tmpname;
  stat fileStat;
  int64_t *local_d8;
  int64_t local_c8 [2];
  stat local_b8;
  
  this->m_Errno = 0;
  this->m_Size = 0xffffffffffffffff;
  this->m_CurrentOffset = 0;
  (this->m_FileName)._M_dataplus._M_p = (pointer)&(this->m_FileName).field_2;
  (this->m_FileName)._M_string_length = 0;
  (this->m_FileName).field_2._M_local_buf[0] = '\0';
  this->m_BytesSent = 0;
  this->m_OperationCount = 0;
  std::__cxx11::string::_M_assign((string *)&this->m_FileName);
  lf_random_string_abi_cxx11_();
  this->m_ID = *local_d8;
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = open((FileName->_M_dataplus)._M_p,0);
  this->m_FileDescriptor = iVar1;
  this->m_Errno = *piVar2;
  iVar1 = fstat(iVar1,&local_b8);
  if (iVar1 == -1) {
    this->m_Errno = *piVar2;
  }
  this->m_Size = local_b8.st_size;
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

AnonSimpleFile(std::string FileName)
    {
        m_FileName = FileName;
        std::string tmpname = lf_random_string();
        struct stat fileStat;

        memcpy(&m_ID, tmpname.c_str(), sizeof(m_ID));
        errno = 0;
        m_FileDescriptor = open(FileName.c_str(), O_RDONLY);
        m_Errno = errno;
        if (fstat(m_FileDescriptor, &fileStat) == -1)
        {
            m_Errno = errno;
        }
        m_Size = static_cast<size_t>(fileStat.st_size);
    }